

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEseqFloatVisitor.cpp
# Opt level: O0

void __thiscall IRT::CEseqFloatVisitor::Visit(CEseqFloatVisitor *this,CMemExpression *expression)

{
  CExpression *pCVar1;
  pointer pCVar2;
  CMemExpression *pCVar3;
  CEseqExpression *this_00;
  CStatement *pCVar4;
  CEseqExpression *local_98;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_78;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_70;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_68;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_60;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_58;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_50;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_48;
  undefined1 local_3d;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_30;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_28;
  CEseqExpression *local_20;
  CEseqExpression *eseq;
  CMemExpression *expression_local;
  CEseqFloatVisitor *this_local;
  
  eseq = (CEseqExpression *)expression;
  expression_local = (CMemExpression *)this;
  pCVar1 = CMemExpression::getAddress(expression);
  (**(pCVar1->super_IExpression).super_INode._vptr_INode)(pCVar1,this);
  pCVar2 = std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
           get(&this->childExpression);
  if (pCVar2 == (pointer)0x0) {
    local_98 = (CEseqExpression *)0x0;
  }
  else {
    local_98 = (CEseqExpression *)
               __dynamic_cast(pCVar2,&CExpression::typeinfo,&CEseqExpression::typeinfo,0);
  }
  local_20 = local_98;
  if (local_98 == (CEseqExpression *)0x0) {
    pCVar3 = (CMemExpression *)operator_new(0x10);
    local_3d = 1;
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_30,&this->childExpression);
    CMemExpression::CMemExpression(pCVar3,&local_30);
    local_3d = 0;
    std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
    unique_ptr<std::default_delete<IRT::CExpression_const>,void>
              ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
               &local_28,(pointer)pCVar3);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::operator=
              (&this->childExpression,&local_28);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_28);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_30);
  }
  else {
    this_00 = (CEseqExpression *)operator_new(0x18);
    pCVar4 = CEseqExpression::getStatement(local_20);
    (*(pCVar4->super_IStatement).super_INode._vptr_INode[3])(&local_58);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
              (&local_50,&local_58);
    pCVar3 = (CMemExpression *)operator_new(0x10);
    pCVar1 = CEseqExpression::getExpression(local_20);
    (*(pCVar1->super_IExpression).super_INode._vptr_INode[3])(&local_78);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_70,&local_78);
    CMemExpression::CMemExpression(pCVar3,&local_70);
    std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
    unique_ptr<std::default_delete<IRT::CExpression_const>,void>
              ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
               &local_68,(pointer)pCVar3);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_60,&local_68);
    CEseqExpression::CEseqExpression(this_00,&local_50,&local_60);
    std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
    unique_ptr<std::default_delete<IRT::CExpression_const>,void>
              ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
               &local_48,(pointer)this_00);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::operator=
              (&this->childExpression,&local_48);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_48);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_60);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_68);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_70);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_78);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_50);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_58);
  }
  return;
}

Assistant:

void IRT::CEseqFloatVisitor::Visit(const IRT::CMemExpression &expression) {
    expression.getAddress()->Accept(*this);

    const CEseqExpression* eseq = CAST_TO_ESEQ(childExpression.get());
    if (eseq == nullptr) {
        childExpression = EMOVE_UNIQ(new CMemExpression(
                std::move(childExpression)
        ));
    } else {
        childExpression = EMOVE_UNIQ(new CEseqExpression(
                std::move(eseq->getStatement()->Copy()),
                EMOVE_UNIQ(new CMemExpression(
                        std::move(eseq->getExpression()->Copy())
                ))
        ));
    }
}